

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void locale_init(UErrorCode *status)

{
  undefined8 *puVar1;
  size_t in_RSI;
  Locale *local_10f8;
  Locale *local_10e8;
  Locale local_10e0;
  Locale local_1000;
  Locale local_f20;
  Locale local_e40;
  Locale local_d60;
  Locale local_c80;
  Locale local_ba0;
  Locale local_ac0;
  Locale local_9e0;
  Locale local_900;
  Locale local_820;
  Locale local_740;
  Locale local_660;
  Locale local_580;
  Locale local_4a0;
  Locale local_3c0;
  Locale local_2e0;
  Locale local_200;
  Locale local_120;
  undefined1 local_29;
  Locale *local_28;
  Locale *local_20;
  undefined1 local_11;
  UErrorCode *local_10;
  UErrorCode *status_local;
  
  local_10 = status;
  puVar1 = (undefined8 *)icu_63::UMemory::operator_new__((UMemory *)0x10a8,in_RSI);
  local_11 = 0;
  local_29 = 0;
  local_10e8 = (Locale *)0x0;
  if (puVar1 != (undefined8 *)0x0) {
    local_11 = 1;
    *puVar1 = 0x13;
    local_10e8 = (Locale *)(puVar1 + 1);
    local_10f8 = local_10e8;
    do {
      local_28 = local_10f8;
      local_29 = 1;
      local_20 = local_10e8;
      icu_63::Locale::Locale(local_10f8);
      local_10f8 = local_10f8 + 1;
    } while (local_10f8 != (Locale *)(puVar1 + 0x215));
  }
  icu_63::gLocaleCache = local_10e8;
  if (local_10e8 == (Locale *)0x0) {
    *local_10 = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE,locale_cleanup);
    icu_63::Locale::Locale(&local_120,"",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x12,&local_120);
    icu_63::Locale::~Locale(&local_120);
    icu_63::Locale::Locale(&local_200,"en",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache,&local_200);
    icu_63::Locale::~Locale(&local_200);
    icu_63::Locale::Locale(&local_2e0,"fr",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 1,&local_2e0);
    icu_63::Locale::~Locale(&local_2e0);
    icu_63::Locale::Locale(&local_3c0,"de",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 2,&local_3c0);
    icu_63::Locale::~Locale(&local_3c0);
    icu_63::Locale::Locale(&local_4a0,"it",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 3,&local_4a0);
    icu_63::Locale::~Locale(&local_4a0);
    icu_63::Locale::Locale(&local_580,"ja",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 4,&local_580);
    icu_63::Locale::~Locale(&local_580);
    icu_63::Locale::Locale(&local_660,"ko",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 5,&local_660);
    icu_63::Locale::~Locale(&local_660);
    icu_63::Locale::Locale(&local_740,"zh",(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 6,&local_740);
    icu_63::Locale::~Locale(&local_740);
    icu_63::Locale::Locale(&local_820,"fr","FR",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 7,&local_820);
    icu_63::Locale::~Locale(&local_820);
    icu_63::Locale::Locale(&local_900,"de","DE",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 8,&local_900);
    icu_63::Locale::~Locale(&local_900);
    icu_63::Locale::Locale(&local_9e0,"it","IT",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 9,&local_9e0);
    icu_63::Locale::~Locale(&local_9e0);
    icu_63::Locale::Locale(&local_ac0,"ja","JP",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 10,&local_ac0);
    icu_63::Locale::~Locale(&local_ac0);
    icu_63::Locale::Locale(&local_ba0,"ko","KR",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xb,&local_ba0);
    icu_63::Locale::~Locale(&local_ba0);
    icu_63::Locale::Locale(&local_c80,"zh","CN",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xc,&local_c80);
    icu_63::Locale::~Locale(&local_c80);
    icu_63::Locale::Locale(&local_d60,"zh","TW",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xd,&local_d60);
    icu_63::Locale::~Locale(&local_d60);
    icu_63::Locale::Locale(&local_e40,"en","GB",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xe,&local_e40);
    icu_63::Locale::~Locale(&local_e40);
    icu_63::Locale::Locale(&local_f20,"en","US",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0xf,&local_f20);
    icu_63::Locale::~Locale(&local_f20);
    icu_63::Locale::Locale(&local_1000,"en","CA",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x10,&local_1000);
    icu_63::Locale::~Locale(&local_1000);
    icu_63::Locale::Locale(&local_10e0,"fr","CA",(char *)0x0,(char *)0x0);
    icu_63::Locale::operator=(icu_63::gLocaleCache + 0x11,&local_10e0);
    icu_63::Locale::~Locale(&local_10e0);
  }
  return;
}

Assistant:

static void U_CALLCONV locale_init(UErrorCode &status) {
    U_NAMESPACE_USE

    U_ASSERT(gLocaleCache == NULL);
    gLocaleCache = new Locale[(int)eMAX_LOCALES];
    if (gLocaleCache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    ucln_common_registerCleanup(UCLN_COMMON_LOCALE, locale_cleanup);
    gLocaleCache[eROOT]          = Locale("");
    gLocaleCache[eENGLISH]       = Locale("en");
    gLocaleCache[eFRENCH]        = Locale("fr");
    gLocaleCache[eGERMAN]        = Locale("de");
    gLocaleCache[eITALIAN]       = Locale("it");
    gLocaleCache[eJAPANESE]      = Locale("ja");
    gLocaleCache[eKOREAN]        = Locale("ko");
    gLocaleCache[eCHINESE]       = Locale("zh");
    gLocaleCache[eFRANCE]        = Locale("fr", "FR");
    gLocaleCache[eGERMANY]       = Locale("de", "DE");
    gLocaleCache[eITALY]         = Locale("it", "IT");
    gLocaleCache[eJAPAN]         = Locale("ja", "JP");
    gLocaleCache[eKOREA]         = Locale("ko", "KR");
    gLocaleCache[eCHINA]         = Locale("zh", "CN");
    gLocaleCache[eTAIWAN]        = Locale("zh", "TW");
    gLocaleCache[eUK]            = Locale("en", "GB");
    gLocaleCache[eUS]            = Locale("en", "US");
    gLocaleCache[eCANADA]        = Locale("en", "CA");
    gLocaleCache[eCANADA_FRENCH] = Locale("fr", "CA");
}